

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleValueHashTableOf.hpp
# Opt level: O0

void __thiscall
SimpleValueHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::removeBucketElem
          (SimpleValueHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *this,void *key,
          XMLSize_t *hashVal)

{
  bool bVar1;
  XMLSize_t XVar2;
  RuntimeException *this_00;
  NoSuchElementException *this_01;
  ValueHashTableBucketElem<unsigned_int> *local_40;
  ValueHashTableBucketElem<unsigned_int> *lastElem;
  ValueHashTableBucketElem<unsigned_int> *curElem;
  XMLSize_t *hashVal_local;
  void *key_local;
  SimpleValueHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher> *this_local;
  
  XVar2 = xercesc_4_0::PtrHasher::getHashVal((PtrHasher *)&this->field_0x10,key,this->fHashModulus);
  *hashVal = XVar2;
  if (this->fHashModulus < *hashVal) {
    this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
    xercesc_4_0::RuntimeException::RuntimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/MemHandlerTest/SimpleValueHashTableOf.hpp"
               ,0x18b,HshTbl_BadHashFromKey,(MemoryManager *)0x0);
    __cxa_throw(this_00,&xercesc_4_0::RuntimeException::typeinfo,
                xercesc_4_0::RuntimeException::~RuntimeException);
  }
  lastElem = this->fBucketList[*hashVal];
  local_40 = (ValueHashTableBucketElem<unsigned_int> *)0x0;
  while( true ) {
    if (lastElem == (ValueHashTableBucketElem<unsigned_int> *)0x0) {
      this_01 = (NoSuchElementException *)__cxa_allocate_exception(0x30);
      xercesc_4_0::NoSuchElementException::NoSuchElementException
                (this_01,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/tests/src/MemHandlerTest/SimpleValueHashTableOf.hpp"
                 ,0x1af,HshTbl_NoSuchKeyExists,(MemoryManager *)0x0);
      __cxa_throw(this_01,&xercesc_4_0::NoSuchElementException::typeinfo,
                  xercesc_4_0::NoSuchElementException::~NoSuchElementException);
    }
    bVar1 = xercesc_4_0::PtrHasher::equals((PtrHasher *)&this->field_0x10,key,lastElem->fKey);
    if (bVar1) break;
    local_40 = lastElem;
    lastElem = lastElem->fNext;
  }
  if (local_40 == (ValueHashTableBucketElem<unsigned_int> *)0x0) {
    this->fBucketList[*hashVal] = lastElem->fNext;
  }
  else {
    local_40->fNext = lastElem->fNext;
  }
  if (lastElem != (ValueHashTableBucketElem<unsigned_int> *)0x0) {
    operator_delete(lastElem,0x18);
  }
  return;
}

Assistant:

void SimpleValueHashTableOf<TVal, THasher>::
removeBucketElem(const void* const key, XMLSize_t& hashVal)
{
    // Hash the key
    hashVal = fHasher.getHashVal(key, fHashModulus);
    if (hashVal > fHashModulus)
        ThrowXML(RuntimeException, XMLExcepts::HshTbl_BadHashFromKey);

    //
    //  Search the given bucket for this key. Keep up with the previous
    //  element so we can patch around it.
    //
    ValueHashTableBucketElem<TVal>* curElem = fBucketList[hashVal];
    ValueHashTableBucketElem<TVal>* lastElem = 0;

    while (curElem)
    {
        if (fHasher.equals(key, curElem->fKey))
        {
            if (!lastElem)
            {
                // It was the first in the bucket
                fBucketList[hashVal] = curElem->fNext;
            }
             else
            {
                // Patch around the current element
                lastElem->fNext = curElem->fNext;
            }

            // Delete the current element
            delete curElem;

            return;
        }

        // Move both pointers upwards
        lastElem = curElem;
        curElem = curElem->fNext;
    }

    // We never found that key
    ThrowXML(NoSuchElementException, XMLExcepts::HshTbl_NoSuchKeyExists);
}